

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O2

void * memleak_alloc(size_t size,char *file,size_t line)

{
  void *addr;
  
  addr = malloc(size);
  if ((addr != (void *)0x0) && ((start_sw & 1) != 0)) {
    pthread_spin_lock(&lock);
    _memleak_add_to_index(addr,size,file,line,'w');
    pthread_spin_unlock(&lock);
  }
  return addr;
}

Assistant:

LIBMEMLEAK_API
void * memleak_alloc(size_t size, char *file, size_t line)
{
    void *addr = (void*)malloc(size);
    if (addr && start_sw) {
        spin_lock(&lock);
        _memleak_add_to_index(addr, size, file, line, INIT_VAL);
        spin_unlock(&lock);
    }

    return addr;
}